

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emle.c
# Opt level: O2

void karma(int ip,int iq,double *phi,double *theta,double *A,double *P,double *V,int N,double *W,
          double *resid,double *sumlog,double *ssq,int iupd,double delta,int *iter,int *nit)

{
  double *pdVar1;
  double dVar2;
  int iVar3;
  double *pdVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  long lVar9;
  int iVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  ulong uVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  
  *iter = 0;
  uVar11 = (ulong)(iq + 1U);
  if ((int)(iq + 1U) <= ip) {
    uVar11 = (ulong)(uint)ip;
  }
  uVar17 = 0;
  iVar10 = (int)uVar11;
  uVar21 = 0;
  if (0 < iVar10) {
    uVar21 = uVar11;
  }
  if (*nit == 0) {
    uVar15 = iVar10 - 1;
    uVar18 = 0;
    if (0 < (int)uVar15) {
      uVar18 = (ulong)uVar15;
    }
    uVar6 = 0;
    if (0 < ip) {
      uVar6 = (ulong)(uint)ip;
    }
    uVar13 = 0;
    if (0 < N) {
      uVar13 = (ulong)(uint)N;
    }
    pdVar1 = P + 1;
    for (; uVar17 != uVar13; uVar17 = uVar17 + 1) {
      dVar22 = W[uVar17];
      if (iupd != 1 || uVar17 != 0) {
        dVar23 = *A;
        if (iVar10 != 1) {
          for (uVar7 = 0; uVar18 != uVar7; uVar7 = uVar7 + 1) {
            A[uVar7] = A[uVar7 + 1];
          }
        }
        A[(int)uVar15] = 0.0;
        if (ip != 0) {
          for (uVar7 = 0; uVar6 != uVar7; uVar7 = uVar7 + 1) {
            A[uVar7] = phi[uVar7] * dVar23 + A[uVar7];
          }
        }
        iVar5 = -1;
        uVar7 = uVar11;
        uVar12 = uVar15;
        uVar8 = uVar15;
        uVar16 = uVar15;
        for (iVar3 = 0; iVar3 != (int)uVar21; iVar3 = iVar3 + 1) {
          lVar19 = (long)iVar5;
          for (lVar20 = 0; (int)uVar8 - lVar19 != lVar20; lVar20 = lVar20 + 1) {
            dVar23 = V[lVar19 + lVar20 + 1];
            pdVar1[lVar19 + lVar20] = dVar23;
            if (uVar16 != (uint)lVar20) {
              lVar9 = (long)(int)uVar12;
              uVar12 = uVar12 + 1;
              pdVar1[lVar19 + lVar20] = dVar23 + P[lVar9 + 1];
            }
          }
          uVar8 = uVar8 + uVar16;
          uVar16 = uVar16 - 1;
          iVar5 = iVar5 + (int)uVar7;
          uVar7 = (ulong)((int)uVar7 - 1);
        }
      }
      dVar23 = ABS(*P);
      dVar24 = dVar22 - *A;
      if (iVar10 != 1) {
        pdVar4 = pdVar1;
        uVar14 = uVar11;
        uVar7 = uVar11;
        for (lVar19 = 1; uVar7 = uVar7 - 1, lVar19 < iVar10; lVar19 = lVar19 + 1) {
          dVar2 = P[lVar19];
          A[lVar19] = (dVar2 / dVar23) * dVar24 + A[lVar19];
          iVar5 = (int)uVar14;
          for (uVar14 = 0; uVar7 != uVar14; uVar14 = uVar14 + 1) {
            P[(long)iVar5 + uVar14] = pdVar4[uVar14] * -(dVar2 / dVar23) + P[(long)iVar5 + uVar14];
          }
          uVar14 = (ulong)(uint)(iVar5 + (int)uVar14);
          pdVar4 = pdVar4 + 1;
        }
      }
      *A = dVar22;
      for (uVar7 = 0; uVar21 != uVar7; uVar7 = uVar7 + 1) {
        P[uVar7] = 0.0;
      }
      resid[uVar17] = dVar24 / SQRT(dVar23);
      *ssq = (dVar24 * dVar24) / dVar23 + *ssq;
      dVar22 = log(dVar23);
      *sumlog = dVar22 + *sumlog;
      *iter = *iter + 1;
    }
    *nit = N;
  }
  else {
    *nit = 0;
    uVar11 = 0;
    if (0 < ip) {
      uVar11 = (ulong)(uint)ip;
    }
    uVar21 = (ulong)(uint)N;
    if (N < 1) {
      uVar21 = uVar17;
    }
    for (; uVar17 != uVar21; uVar17 = uVar17 + 1) {
      dVar22 = W[uVar17];
      if (ip != 0) {
        uVar18 = uVar17;
        for (uVar6 = 0; uVar11 != uVar6; uVar6 = uVar6 + 1) {
          uVar15 = (int)uVar18 - 1;
          if (0 < (int)uVar18) {
            dVar22 = dVar22 - phi[uVar6] * W[uVar15];
          }
          uVar18 = (ulong)uVar15;
        }
      }
      resid[uVar17] = dVar22;
      *ssq = dVar22 * dVar22 + *ssq;
      *iter = *iter + 1;
    }
  }
  if (*iter == 0) {
    *iter = 1;
  }
  return;
}

Assistant:

void karma(int ip,int iq,double *phi,double *theta,double *A,double *P,double*V,int N,
	double *W,double *resid,double *sumlog,double *ssq,int iupd,double delta,int *iter,int *nit) {
	int ir,np,i,j,ir1,inde,swtch,ind,indn,l,ii,indw;
	double wnext,dt,A1,ft,ut,g,et;
	double *E;

	ir = iq + 1;
	swtch = 0;
	*iter = 0;

	if (ir < ip) {
		ir = ip;
	}
	E = (double*)malloc(sizeof(double)* ir);
	np = (ir * (ir + 1)) / 2;

	ir1 = ir - 1;
	for (i = 0; i < ir; ++i) {
		E[i] = 0.0;
	}
	inde = 0;

	if (*nit == 0) {
		for (i = 0; i < N; ++i) {//500
			wnext = W[i];
			if (iupd != 1 || i > 0) {//300
				dt = 0.0;
				if (ir != 1) {
					dt = P[ir];
				}
				/*
				if (dt < delta) {
					swtch = 1;
					*nit = i + 1;
					break;//610
				}
				*/
				A1 = A[0];
				if (ir != 1) {//110
					for (j = 0; j < ir1; ++j) {
						A[j] = A[j + 1];
					}
				}//110
				A[ir - 1] = 0.0;
				if (ip != 0) {//200
					for (j = 0; j < ip; ++j) {
						A[j] += phi[j] * A1;
					}
				}//200
				ind = -1;
				indn = ir-1;
				for (l = 0; l < ir; ++l) {
					for (j = l; j < ir; ++j) {
						ind++;
						P[ind] = V[ind];
						if (j != (ir - 1)) {
							indn++;
							P[ind] += P[indn];
						}
					}
				}
			}//300
			ft = fabs(P[0]);//modification
			ut = wnext - A[0];
			if (ir != 1) {//410
				ind = ir;
				for (j = 1; j < ir; ++j) {
					g = P[j] / ft;
					A[j] += g*ut;
					for (l = j; l < ir; ++l) {
						P[ind] -= g*P[l];
						ind++;
					}
				}
			}//410
			A[0] = wnext;
			for (l = 0; l < ir; ++l) {
				P[l] = 0.0;
			}
			resid[i] = ut / sqrt(ft);
			E[inde] = resid[i];
			inde++;
			if (inde >= iq) {
				inde = 0;
			}
			*ssq += (ut*ut) / ft;
			*sumlog += log(ft);// alog
			*iter = *iter + 1;;
			//printf(" sl %g", *sumlog);


		}//500
		if (swtch == 0) {
			*nit = N;
		}
	}
	else {
		i = 0;
		*nit = i;
		for (ii = i; ii < N; ++ii) {//650
			et = W[ii];
			indw = ii;
			if (ip != 0) {//630
				for (j = 0; j < ip; ++j) {
					indw--;
					if (indw >= 0) {
						et -= phi[j] * W[indw];
					}
				}
			}//630
			if (iq != 0) {//645
				for (j = 0; j < iq; ++i) {
					inde--;
					if (inde == -1) {
						inde = iq-1;
					}
					et -= theta[j] * E[inde];
				}
			}//645
			E[inde] = et;
			resid[ii] = et;
			*ssq += et*et;
			*iter = *iter + 1;
			inde++;
			if (inde >= iq) {
				inde = 0;
			}
		}//650

	}
	if (*iter == 0) {
		*iter = 1;
	}
	free(E);
}